

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astring.c
# Opt level: O3

bool AString_reserve(AString *str,size_t reserveSize)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  
  if (str == (AString *)0x0) {
    return false;
  }
  if (str->capacity < reserveSize) {
    uVar3 = 8;
    if (7 < reserveSize) {
      auVar5._8_4_ = (int)(reserveSize >> 0x20);
      auVar5._0_8_ = reserveSize;
      auVar5._12_4_ = 0x45300000;
      dVar4 = log(((auVar5._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)reserveSize) - 4503599627370496.0)) * 0.5);
      dVar4 = ceil(dVar4 / 0.6931471805599453);
      dVar4 = exp2(dVar4);
      uVar1 = (ulong)(dVar4 + dVar4);
      uVar1 = (long)((dVar4 + dVar4) - 9.223372036854776e+18) & (long)uVar1 >> 0x3f | uVar1;
      uVar3 = reserveSize + 0x400;
      if (uVar1 - reserveSize < 0x401) {
        uVar3 = uVar1;
      }
    }
    if (uVar3 < reserveSize) {
      return false;
    }
    pcVar2 = (char *)(*str->reallocator)(str->buffer,uVar3 + 1);
    if (pcVar2 == (char *)0x0) {
      return false;
    }
    str->capacity = uVar3;
    str->buffer = pcVar2;
  }
  return true;
}

Assistant:

ACUTILS_HD_FUNC bool AString_reserve(struct AString *str, size_t reserveSize)
{
    if(str != nullptr) {
        if(reserveSize > str->capacity) {
            size_t aimedCapacity = private_ACUtils_AString_capacityMin;
            if(reserveSize >= private_ACUtils_AString_capacityMin) {
                double multiplierExponent =
                        (ceil(log((double) reserveSize / 2) / log(private_ACUtils_AString_capacityMul)));
                aimedCapacity = (size_t) (2 * pow((double) private_ACUtils_AString_capacityMul, multiplierExponent));
                if(aimedCapacity - reserveSize > private_ACUtils_AString_capacityAllocMax)
                    aimedCapacity = reserveSize + private_ACUtils_AString_capacityAllocMax;
            }
            if(aimedCapacity >= reserveSize) {
                char *tmpBuffer = (char*) str->reallocator(str->buffer, (aimedCapacity + 1) * sizeof(char));
                if(tmpBuffer != nullptr) {
                    str->capacity = aimedCapacity;
                    str->buffer = tmpBuffer;
                    return true;
                }
            }
        } else {
            return true;
        }
    }
    return false;
}